

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

char * GameParamString(pyhanabi_game_t *game)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  __node_base _Var4;
  __string_type __str;
  string str;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  long *local_e8;
  ulong local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  undefined1 *local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  char *local_88;
  undefined8 local_80;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (game == (pyhanabi_game_t *)0x0) {
    __assert_fail("game != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x22b,"char *GameParamString(pyhanabi_game_t *)");
  }
  if ((HanabiGame *)game->game != (HanabiGame *)0x0) {
    local_88 = local_78;
    local_80 = 0;
    local_78[0] = '\0';
    hanabi_learning_env::HanabiGame::Parameters_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_68,(HanabiGame *)game->game);
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var4._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,_Var4._M_nxt[1]._M_nxt,
                   (long)&(_Var4._M_nxt[1]._M_nxt)->_M_nxt + (long)&(_Var4._M_nxt[2]._M_nxt)->_M_nxt
                  );
        std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a0,0,'\x01');
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_a8,(ulong)_Var4._M_nxt[5]._M_nxt);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_d8 = *plVar3;
          lStack_d0 = plVar1[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar3;
          local_e8 = (long *)*plVar1;
        }
        local_e0 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_e8,local_e0,0,'\x01');
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_b8 = *plVar3;
          lStack_b0 = plVar1[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar3;
          local_c8 = (long *)*plVar1;
        }
        local_c0 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_c8);
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
      } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
    }
    pcVar2 = strdup(local_88);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    return pcVar2;
  }
  __assert_fail("game->game != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x22c,"char *GameParamString(pyhanabi_game_t *)");
}

Assistant:

char* GameParamString(pyhanabi_game_t* game) {
  REQUIRE(game != nullptr);
  REQUIRE(game->game != nullptr);
  std::string str;
  auto params = reinterpret_cast<hanabi_learning_env::HanabiGame*>(game->game)
                    ->Parameters();
  for (const auto& item : params) {
    str += item.first + '=' + item.second + '\n';
  }
  return strdup(str.c_str());
}